

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  basic_appender<char> bVar1;
  int in_stack_00000228;
  sign in_stack_0000022c;
  format_specs *in_stack_00000230;
  decimal_fp<float> *in_stack_00000238;
  locale_ref in_stack_00000240;
  basic_appender<char> in_stack_00000248;
  
  bVar1 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
                    (in_stack_00000248,in_stack_00000238,in_stack_00000230,in_stack_0000022c,
                     in_stack_00000228,in_stack_00000240);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, const DecimalFP& f,
                                 const format_specs& specs, sign s,
                                 int exp_upper, locale_ref loc) -> OutputIt {
  if (is_constant_evaluated()) {
    return do_write_float<Char, OutputIt, DecimalFP,
                          fallback_digit_grouping<Char>>(out, f, specs, s,
                                                         exp_upper, loc);
  } else {
    return do_write_float<Char>(out, f, specs, s, exp_upper, loc);
  }
}